

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O3

fdb_status wal_snap_insert(snap_handle *shandle,fdb_doc *doc,uint64_t offset,wal_item_action action)

{
  uint64_t *puVar1;
  bool bVar2;
  avl_node *paVar3;
  avl_node *paVar4;
  void *pvVar5;
  void *pvVar6;
  long lVar7;
  wal_item_header query_hdr;
  wal_item query;
  undefined1 auStack_e8 [24];
  void *local_d0;
  undefined2 local_c8;
  undefined1 *local_88;
  avl_node local_48;
  
  local_88 = auStack_e8;
  local_d0 = doc->key;
  local_c8 = (undefined2)doc->keylen;
  paVar4 = avl_search(&shandle->key_tree,&local_48,_snap_cmp_bykey);
  if (paVar4 == (avl_node *)0x0) {
    pvVar5 = calloc(1,0x80);
    pvVar6 = malloc(0x38);
    *(void **)((long)pvVar5 + 0x28) = pvVar6;
    *(void **)((long)pvVar6 + 0x18) = doc->key;
    *(short *)((long)pvVar6 + 0x20) = (short)doc->keylen;
    *(fdb_seqnum_t *)((long)pvVar5 + 0x58) = doc->seqnum;
    *(wal_item_action *)((long)pvVar5 + 0x48) = action;
    *(uint64_t *)((long)pvVar5 + 0x50) = offset;
    avl_insert(&shandle->key_tree,(avl_node *)((long)pvVar5 + 0x68),_snap_cmp_bykey);
    avl_insert(&shandle->seq_tree,(avl_node *)((long)pvVar5 + 0x10),_wal_cmp_byseq);
    puVar1 = &(shandle->stat).wal_ndocs;
    *puVar1 = *puVar1 + 1;
    if (doc->deleted == true) {
      puVar1 = &(shandle->stat).wal_ndeletes;
      *puVar1 = *puVar1 + 1;
    }
    *(snap_handle **)((long)pvVar5 + 0x40) = shandle;
    return FDB_RESULT_SUCCESS;
  }
  free(paVar4[-3].left[1].parent);
  paVar3 = paVar4[-3].left;
  paVar3[1].parent = (avl_node *)doc->key;
  *(short *)&paVar3[1].left = (short)doc->keylen;
  if (paVar4[-1].left != (avl_node *)doc->seqnum) {
    paVar4[-1].left = (avl_node *)doc->seqnum;
    avl_remove(&shandle->seq_tree,(avl_node *)&paVar4[-4].left);
    avl_insert(&shandle->seq_tree,(avl_node *)&paVar4[-4].left,_wal_cmp_byseq);
  }
  bVar2 = doc->deleted;
  if (*(char *)&paVar4[-2].right == '\x01') {
    lVar7 = -1;
    if ((bVar2 & 1U) != 0) goto LAB_00117912;
  }
  else if ((*(char *)&paVar4[-2].right != '\0') || (lVar7 = 1, (bVar2 & 1U) == 0))
  goto LAB_00117912;
  puVar1 = &(shandle->stat).wal_ndeletes;
  *puVar1 = *puVar1 + lVar7;
LAB_00117912:
  *(bool *)&paVar4[-2].right = bVar2;
  paVar4[-1].parent = (avl_node *)offset;
  return FDB_RESULT_SUCCESS;
}

Assistant:

fdb_status wal_snap_insert(struct snap_handle *shandle,
                           fdb_doc *doc,
                           uint64_t offset,
                           wal_item_action action)
{
    struct wal_item query;
    struct wal_item_header query_hdr;
    struct wal_item *item;
    struct avl_node *node;
    query_hdr.key = doc->key;
    query_hdr.keylen = doc->keylen;
    query.header = &query_hdr;
    node = avl_search(&shandle->key_tree, &query.avl_keysnap, _snap_cmp_bykey);

    if (!node) {
        item = (struct wal_item *) calloc(1, sizeof(struct wal_item));
        item->header = (struct wal_item_header *) malloc(
                                  sizeof(struct wal_item_header));
        item->header->key = doc->key;
        item->header->keylen = doc->keylen;
        item->seqnum = doc->seqnum;
        item->action = action;
        item->offset = offset;
        avl_insert(&shandle->key_tree, &item->avl_keysnap, _snap_cmp_bykey);
        avl_insert(&shandle->seq_tree, &item->avl_seq, _wal_cmp_byseq);

        // Note: same logic in wal_commit
        shandle->stat.wal_ndocs++;
        if (doc->deleted) {
            shandle->stat.wal_ndeletes++;
        }
        item->shandle = shandle;
    } else {
        // replace existing node with new values so there are no duplicates
        item = _get_entry(node, struct wal_item, avl_keysnap);
        free(item->header->key);
        item->header->key = doc->key;
        item->header->keylen = doc->keylen;
        if (item->seqnum != doc->seqnum) { // Re-index duplicate into seqtree
            item->seqnum = doc->seqnum;
            avl_remove(&shandle->seq_tree, &item->avl_seq);
            avl_insert(&shandle->seq_tree, &item->avl_seq, _wal_cmp_byseq);
        }

        // Note: same logic in wal_commit
        if (item->action == WAL_ACT_INSERT &&
            doc->deleted) {
            shandle->stat.wal_ndeletes++;
        } else if (item->action == WAL_ACT_LOGICAL_REMOVE &&
                   !doc->deleted) {
            shandle->stat.wal_ndeletes--;
        }

        item->action = doc->deleted ? WAL_ACT_LOGICAL_REMOVE : WAL_ACT_INSERT;
        item->offset = offset;
    }
    return FDB_RESULT_SUCCESS;
}